

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_json_generator.cc
# Opt level: O0

void __thiscall t_json_generator::generate_field(t_json_generator *this,t_field *field)

{
  bool bVar1;
  int32_t val;
  e_req eVar2;
  string *psVar3;
  t_type *ptVar4;
  size_type sVar5;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  t_const_value *ptVar6;
  allocator local_271;
  string local_270;
  allocator local_249;
  string local_248;
  allocator local_221;
  string local_220;
  allocator local_1f9;
  string local_1f8;
  allocator local_1d1;
  string local_1d0;
  string local_1b0;
  string local_190;
  reference local_170;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *annotation;
  iterator __end2;
  iterator __begin2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range2;
  string local_148;
  string local_128;
  allocator local_101;
  string local_100;
  string local_e0;
  allocator local_b9;
  string local_b8;
  string local_98;
  allocator local_71;
  string local_70;
  allocator local_39;
  string local_38;
  t_field *local_18;
  t_field *field_local;
  t_json_generator *this_local;
  
  local_18 = field;
  field_local = (t_field *)this;
  start_object(this,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_38,"key",&local_39);
  val = t_field::get_key(local_18);
  write_key_and_integer(this,&local_38,val);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_70,"name",&local_71);
  psVar3 = t_field::get_name_abi_cxx11_(local_18);
  std::__cxx11::string::string((string *)&local_98,(string *)psVar3);
  write_key_and_string(this,&local_70,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_b8,"typeId",&local_b9);
  ptVar4 = t_field::get_type(local_18);
  get_type_name_abi_cxx11_(&local_e0,this,ptVar4);
  write_key_and_string(this,&local_b8,&local_e0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_b9);
  ptVar4 = t_field::get_type(local_18);
  write_type_spec_object(this,"type",ptVar4);
  bVar1 = t_doc::has_doc(&local_18->super_t_doc);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_100,"doc",&local_101);
    psVar3 = t_doc::get_doc_abi_cxx11_(&local_18->super_t_doc);
    std::__cxx11::string::string((string *)&local_128,(string *)psVar3);
    write_key_and_string(this,&local_100,&local_128);
    std::__cxx11::string::~string((string *)&local_128);
    std::__cxx11::string::~string((string *)&local_100);
    std::allocator<char>::~allocator((allocator<char> *)&local_101);
  }
  sVar5 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::size(&local_18->annotations_);
  if (sVar5 != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_148,"annotations",(allocator *)((long)&__range2 + 7));
    write_key_and(this,&local_148);
    std::__cxx11::string::~string((string *)&local_148);
    std::allocator<char>::~allocator((allocator<char> *)((long)&__range2 + 7));
    start_object(this,true);
    this_00 = &local_18->annotations_;
    __end2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::begin(this_00);
    annotation = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::end(this_00);
    while (bVar1 = std::operator!=(&__end2,(_Self *)&annotation), bVar1) {
      local_170 = std::
                  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::operator*(&__end2);
      std::__cxx11::string::string((string *)&local_190,(string *)local_170);
      std::__cxx11::string::string((string *)&local_1b0,(string *)&local_170->second);
      write_key_and_string(this,&local_190,&local_1b0);
      std::__cxx11::string::~string((string *)&local_1b0);
      std::__cxx11::string::~string((string *)&local_190);
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator++(&__end2);
    }
    end_object(this);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1d0,"required",&local_1d1);
  write_key_and(this,&local_1d0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1d1);
  eVar2 = t_field::get_req(local_18);
  if (eVar2 == T_REQUIRED) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_1f8,"required",&local_1f9);
    write_string(this,&local_1f8);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::allocator<char>::~allocator((allocator<char> *)&local_1f9);
  }
  else if (eVar2 == T_OPT_IN_REQ_OUT) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_220,"req_out",&local_221);
    write_string(this,&local_220);
    std::__cxx11::string::~string((string *)&local_220);
    std::allocator<char>::~allocator((allocator<char> *)&local_221);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_248,"optional",&local_249);
    write_string(this,&local_248);
    std::__cxx11::string::~string((string *)&local_248);
    std::allocator<char>::~allocator((allocator<char> *)&local_249);
  }
  ptVar6 = t_field::get_value(local_18);
  if (ptVar6 != (t_const_value *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_270,"default",&local_271);
    write_key_and(this,&local_270);
    std::__cxx11::string::~string((string *)&local_270);
    std::allocator<char>::~allocator((allocator<char> *)&local_271);
    ptVar6 = t_field::get_value(local_18);
    write_const_value(this,ptVar6,false);
  }
  end_object(this);
  return;
}

Assistant:

void t_json_generator::generate_field(t_field* field) {
  start_object();

  write_key_and_integer("key", field->get_key());
  write_key_and_string("name", field->get_name());
  write_key_and_string("typeId", get_type_name(field->get_type()));
  write_type_spec_object("type", field->get_type());

  if (field->has_doc()) {
    write_key_and_string("doc", field->get_doc());
  }

  if (field->annotations_.size() > 0) {
    write_key_and("annotations");
    start_object();
    for (auto & annotation : field->annotations_) {
      write_key_and_string(annotation.first, annotation.second);
    }
    end_object();
  }

  write_key_and("required");
  switch (field->get_req()) {
  case t_field::T_REQUIRED:
    write_string("required");
    break;
  case t_field::T_OPT_IN_REQ_OUT:
    write_string("req_out");
    break;
  default:
    write_string("optional");
    break;
  }

  if (field->get_value()) {
    write_key_and("default");
    write_const_value(field->get_value());
  }

  end_object();
}